

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ap_str.c
# Opt level: O1

size_t ap_str_strlcpy(char *dst,char *src,size_t size)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  size_t n;
  char *s;
  long lVar4;
  bool bVar5;
  
  pcVar2 = src;
  if (size == 0) {
    bVar5 = true;
  }
  else {
    lVar4 = size - 1;
    do {
      bVar5 = lVar4 == 0;
      lVar4 = lVar4 + -1;
      if (bVar5) break;
      cVar1 = *pcVar2;
      pcVar2 = pcVar2 + 1;
      *dst = cVar1;
      dst = dst + 1;
    } while (cVar1 != '\0');
  }
  if (bVar5) {
    pcVar3 = pcVar2;
    if (size != 0) {
      *dst = '\0';
    }
    do {
      pcVar2 = pcVar3 + 1;
      cVar1 = *pcVar3;
      pcVar3 = pcVar2;
    } while (cVar1 != '\0');
  }
  return (size_t)(pcVar2 + ~(ulong)src);
}

Assistant:

size_t ap_str_strlcpy (char *dst, const char *src, size_t size)
{
	char		*d		= dst;
	const char	*s		= src;
	size_t		n		= size;

	/* Copy as many bytes as will fit */
	if (n != 0)
	{
		while (--n != 0)
		{
			if ((*d++ = *s++) == '\0')
			{
				break;
			}
		}
	}

	/* Not enough room in dst, add NUL and traverse rest of src */
	if (n == 0)
	{
		if (size != 0)
		{
			*d = '\0'; /* NUL-terminate dst */
		}
		
		while (*s++);
	}

	return(s - src - 1); /* count does not include NUL */
}